

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleIIgs.cpp
# Opt level: O1

void __thiscall Apple::IIgs::ConcreteMachine::~ConcreteMachine(ConcreteMachine *this)

{
  function<void_(Cycles)> *pfVar1;
  FIRFilter *__ptr;
  pointer psVar2;
  pointer pdVar3;
  Flywheel *pFVar4;
  pointer puVar5;
  _Manager_type p_Var6;
  pointer pMVar7;
  long lVar8;
  
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_set_activity_observer_0059bb80;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0059bc10;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0059bc30;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_0059bc48;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0059bc60;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0059bc90;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0059bcd0;
  (this->super_MouseMachine)._vptr_MouseMachine = (_func_int **)&DAT_0059bce8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0059bd00;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0059bd38;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&this->audio_queue_);
  std::
  vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ::~vector(&(this->joysticks_).joysticks_);
  (this->speaker_).
  super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
  .super_Speaker._vptr_Speaker = (_func_int **)&PTR__LowpassBase_0059bf80;
  __ptr = (this->speaker_).
          super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
          .filter_._M_t.
          super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
          .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl;
  if (__ptr != (FIRFilter *)0x0) {
    std::default_delete<SignalProcessing::FIRFilter>::operator()
              ((default_delete<SignalProcessing::FIRFilter> *)
               &(this->speaker_).
                super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
                .filter_,__ptr);
  }
  (this->speaker_).
  super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
  .filter_._M_t.
  super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
  .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl = (FIRFilter *)0x0;
  psVar2 = (this->speaker_).
           super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
           .output_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2,(long)(this->speaker_).
                                 super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
                                 .output_buffer_.super__Vector_base<short,_std::allocator<short>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar2);
  }
  psVar2 = (this->speaker_).
           super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
           .input_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2,(long)(this->speaker_).
                                 super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
                                 .input_buffer_.super__Vector_base<short,_std::allocator<short>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar2);
  }
  (this->speaker_).
  super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
  .super_Speaker._vptr_Speaker = (_func_int **)&PTR__Speaker_00593c18;
  psVar2 = (this->speaker_).
           super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
           .super_Speaker.mix_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2,(long)*(pointer *)
                                  ((long)&(this->speaker_).
                                          super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
                                          .super_Speaker.mix_buffer_.
                                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)psVar2);
  }
  pdVar3 = (this->mixer_).volumes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3,(long)(this->mixer_).volumes_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar3);
  }
  psVar2 = (this->mixer_).source_holder_.conversion_source_.
           super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2,(long)(this->mixer_).source_holder_.conversion_source_.
                                 super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)psVar2);
  }
  psVar2 = (this->mixer_).source_holder_.next_source_.conversion_source_.
           super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2,(long)*(pointer *)
                                  ((long)&(this->mixer_).source_holder_.next_source_.
                                          conversion_source_.
                                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)psVar2);
  }
  Concurrency::AsyncTaskQueue<false,_true,_void>::~AsyncTaskQueue(&this->audio_queue_);
  lVar8 = 0;
  do {
    Storage::Disk::Drive::~Drive((Drive *)(&this->field_0x14848 + lVar8));
    lVar8 = lVar8 + -0x178;
  } while (lVar8 != -0x2f0);
  lVar8 = 0;
  do {
    Storage::Disk::Drive::~Drive((Drive *)(&this->field_0x14558 + lVar8));
    lVar8 = lVar8 + -0x178;
  } while (lVar8 != -0x2f0);
  (this->adb_glu_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_0059bea8;
  ADB::GLU::~GLU(&(this->adb_glu_).object_);
  (this->video_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_0059be78;
  pFVar4 = (this->video_).object_.crt_.vertical_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar4 != (Flywheel *)0x0) {
    operator_delete(pFVar4,0x24);
  }
  (this->video_).object_.crt_.vertical_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  pFVar4 = (this->video_).object_.crt_.horizontal_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar4 != (Flywheel *)0x0) {
    operator_delete(pFVar4,0x24);
  }
  (this->video_).object_.crt_.horizontal_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  puVar5 = (this->video_).object_.super_VideoSwitches<Cycles>.character_rom_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)*(pointer *)
                                  ((long)&(this->video_).object_.super_VideoSwitches<Cycles>.
                                          character_rom_.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)puVar5);
  }
  p_Var6 = (this->video_).object_.super_VideoSwitches<Cycles>.deferrer_.target_.super__Function_base
           ._M_manager;
  if (p_Var6 != (_Manager_type)0x0) {
    pfVar1 = &(this->video_).object_.super_VideoSwitches<Cycles>.deferrer_.target_;
    (*p_Var6)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  std::
  vector<DeferredQueue<Cycles>::DeferredAction,_std::allocator<DeferredQueue<Cycles>::DeferredAction>_>
  ::~vector((vector<DeferredQueue<Cycles>::DeferredAction,_std::allocator<DeferredQueue<Cycles>::DeferredAction>_>
             *)&(this->video_).object_.super_VideoSwitches<Cycles>.deferrer_);
  puVar5 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->rom_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  puVar5 = (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->ram_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  pMVar7 = (this->m65816_).super_ProcessorBase.super_ProcessorStorage.micro_ops_.
           super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pMVar7 != (pointer)0x0) {
    operator_delete(pMVar7,(long)*(pointer *)
                                  ((long)&(this->m65816_).super_ProcessorBase.super_ProcessorStorage
                                          .micro_ops_.
                                          super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pMVar7);
  }
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_005a16c0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_005a16f0;
  Inputs::Keyboard::~Keyboard(&(this->super_MappedKeyboardMachine).keyboard_);
  return;
}

Assistant:

~ConcreteMachine() {
			audio_queue_.flush();
		}